

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chi_square_dist.hpp
# Opt level: O3

result_type_conflict1 __thiscall
trng::chi_square_dist<float>::pdf(chi_square_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  float fVar2;
  result_type_conflict1 rVar3;
  
  rVar3 = 0.0;
  if (0.0 <= x) {
    fVar1 = powf(x * 0.5,(float)(this->P).nu_ * 0.5 + -1.0);
    fVar2 = lgammaf((float)(this->P).nu_ * 0.5);
    fVar2 = expf(fVar2 + x * 0.5);
    rVar3 = fVar1 / (fVar2 + fVar2);
  }
  return rVar3;
}

Assistant:

pdf(result_type x) const {
      if (x < 0)
        return 0;
      x /= 2;
      return math::pow(x, P.nu() / result_type(2) - 1) /
             (math::exp(x + math::ln_Gamma(P.nu() / result_type(2))) * 2);
    }